

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_LongLongsEqualFailure_Test::~TEST_TestFailure_LongLongsEqualFailure_Test
          (TEST_TestFailure_LongLongsEqualFailure_Test *this)

{
  TEST_TestFailure_LongLongsEqualFailure_Test *this_local;
  
  ~TEST_TestFailure_LongLongsEqualFailure_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestFailure, LongLongsEqualFailure)
{
#if CPPUTEST_USE_LONG_LONG
    LongLongsEqualFailure f(test, failFileName, failLineNumber, 1, 2, "");
    FAILURE_EQUAL("expected <1 (0x1)>\n\tbut was  <2 (0x2)>", f);
#else
    cpputest_longlong dummy_longlong;
    LongLongsEqualFailure f(test, failFileName, failLineNumber, dummy_longlong, dummy_longlong, "");
    FAILURE_EQUAL("expected <<longlong_unsupported> >\n\tbut was  <<longlong_unsupported> >", f);
#endif
}